

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

SpectrumImageTexture * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::SpectrumImageTexture,pbrt::SpectrumImageTexture&>
          (polymorphic_allocator<std::byte> *this,SpectrumImageTexture *args)

{
  MIPMap *pMVar1;
  bool bVar2;
  undefined3 uVar3;
  int iVar4;
  undefined4 extraout_var;
  SpectrumImageTexture *pSVar5;
  
  iVar4 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x20,8);
  pSVar5 = (SpectrumImageTexture *)CONCAT44(extraout_var,iVar4);
  (pSVar5->super_ImageTextureBase).mapping.
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = 0;
  (pSVar5->super_ImageTextureBase).mapping.
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (args->super_ImageTextureBase).mapping.
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  bVar2 = (args->super_ImageTextureBase).invert;
  uVar3 = *(undefined3 *)&(args->super_ImageTextureBase).field_0xd;
  pMVar1 = (args->super_ImageTextureBase).mipmap;
  (pSVar5->super_ImageTextureBase).scale = (args->super_ImageTextureBase).scale;
  (pSVar5->super_ImageTextureBase).invert = bVar2;
  *(undefined3 *)&(pSVar5->super_ImageTextureBase).field_0xd = uVar3;
  (pSVar5->super_ImageTextureBase).mipmap = pMVar1;
  pSVar5->spectrumType = args->spectrumType;
  return pSVar5;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }